

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::Arena::CleanupList(Arena *this)

{
  undefined8 *puVar1;
  
  for (puVar1 = *(undefined8 **)(this + 0x20); puVar1 != (undefined8 *)0x0;
      puVar1 = (undefined8 *)puVar1[2]) {
    (*(code *)puVar1[1])(*puVar1);
  }
  *(undefined8 *)(this + 0x20) = 0;
  return;
}

Assistant:

void Arena::CleanupList() {
  Node* head =
      reinterpret_cast<Node*>(google::protobuf::internal::NoBarrier_Load(&cleanup_list_));
  while (head != NULL) {
    head->cleanup(head->elem);
    head = head->next;
  }
  cleanup_list_ = 0;
}